

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ab_algorithm.c
# Opt level: O2

void aba_c(void)

{
  long lVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  code *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  long local_190;
  solver_state_c s;
  
  setup_simple_state_c(&two_dof_robot_c,&s);
  *s.q = 1.0;
  s.q[1] = 1.0;
  *s.qd = 1.0;
  s.qd[1] = 1.0;
  ((s.f_ext[(long)s.nbody + -1].force)->field_0).field_0.x = 1.0;
  uVar10 = (ulong)s.nbody;
  ((s.f_ext[uVar10 - 1].force)->field_0).field_0.y = 1.0;
  ((s.f_ext[uVar10 - 1].force)->field_0).field_0.z = 1.0;
  *s.tau_ff = 1.0;
  s.tau_ff[1] = 1.0;
  ((s.xdd)->linear_acceleration->field_0).field_0.z = 9.81;
  lVar15 = 0x10;
  lVar8 = 0xd8;
  lVar9 = 0;
  lVar7 = 0;
  for (lVar6 = 1; lVar6 <= (int)uVar10; lVar6 = lVar6 + 1) {
    piVar13 = (int *)(_kca_ifk + lVar9 + 0x10);
    lVar11 = (long)*piVar13 * 0x40;
    (**(code **)(&kcc_joint + lVar11))
              (piVar13,(long)s.q + lVar7,(long)&s.x_jnt[-1].rotation + lVar15);
    gc_pose_compose((long)&s.x_jnt[-1].rotation + lVar15,_kca_ifk + lVar9,
                    (long)&s.x_rel[-1].rotation + lVar15);
    (**(code **)(gc_acc_twist_tf_ref_to_tgt + lVar11))
              (piVar13,(long)s.qd + lVar7,(long)&s.xd_jnt[-1].angular_velocity + lVar15);
    gc_twist_tf_ref_to_tgt
              ((long)&s.x_rel[-1].rotation + lVar15,(long)&s.xd[-1].angular_velocity + lVar15,
               (long)&s.xd_tf[-1].angular_velocity + lVar15);
    gc_twist_accumulate((long)&s.xd_tf[-1].angular_velocity + lVar15,
                        (long)&s.xd_jnt[-1].angular_velocity + lVar15,
                        (long)&(s.xd)->angular_velocity + lVar15);
    (**(code **)(&two_dof_robot_c + lVar11))
              (piVar13,(long)&(s.xd)->angular_velocity + lVar15,(long)s.qd + lVar7,
               (long)&s.xdd_bias[-1].angular_acceleration + lVar15);
    mc_rbi_to_abi(_kca_ifk + lVar9 + 0x28,(long)&((s.m_art)->zeroth_moment_of_mass).field_0 + lVar8)
    ;
    mc_rbi_map_twist_to_momentum
              (_kca_ifk + lVar9 + 0x28,(long)&(s.xd)->angular_velocity + lVar15,
               (long)&s.p[-1].angular_momentum + lVar15);
    mc_momentum_derive((long)&(s.xd)->angular_velocity + lVar15,
                       (long)&s.p[-1].angular_momentum + lVar15,
                       (long)&(s.f_bias_art)->torque + lVar15);
    mc_wrench_invert((long)&s.f_ext[-1].torque + lVar15,(long)&(s.f_ext_art)->torque + lVar15,1);
    uVar10 = (ulong)(uint)s.nbody;
    lVar15 = lVar15 + 0x10;
    lVar8 = lVar8 + 0xd8;
    lVar7 = lVar7 + 8;
    lVar9 = lVar9 + 0x90;
  }
  uVar12 = uVar10 & 0xffffffff;
  local_190 = uVar12 * 8;
  lVar7 = uVar12 * 0x90 + -0x80;
  lVar6 = uVar12 * 0xd8;
  lVar15 = uVar12 << 4;
  while( true ) {
    local_190 = local_190 + -8;
    if ((int)uVar10 < 1) break;
    lVar11 = _kca_ifk + lVar7;
    lVar9 = (long)*(int *)(_kca_ifk + lVar7) * 0x40;
    (**(code **)(ga_pose_compose + lVar9))
              (lVar11,(long)&((s.m_art)->zeroth_moment_of_mass).field_0 + lVar6,
               (long)&s.m_app[-1].zeroth_moment_of_mass.field_0 + lVar6);
    mc_abi_tf_tgt_to_ref
              ((long)&s.x_rel[-1].rotation + lVar15,
               (long)&s.m_app[-1].zeroth_moment_of_mass.field_0 + lVar6,
               (long)&((s.m_tf)->zeroth_moment_of_mass).field_0 + lVar6);
    lVar8 = (long)&s.m_art[-1].zeroth_moment_of_mass.field_0 + lVar6;
    mc_abi_add(lVar8,(long)&((s.m_tf)->zeroth_moment_of_mass).field_0 + lVar6,lVar8);
    mc_abi_map_acc_twist_to_wrench
              ((long)&((s.m_art)->zeroth_moment_of_mass).field_0 + lVar6,
               (long)&s.xdd_bias[-1].angular_acceleration + lVar15,
               (long)&s.f_bias_eom[-1].torque + lVar15);
    lVar8 = (long)&s.f_bias_eom[-1].torque + lVar15;
    mc_wrench_add(lVar8,(long)&(s.f_bias_art)->torque + lVar15,lVar8,1);
    pcVar5 = *(code **)(mc_abi_map_acc_twist_to_wrench + lVar9);
    (*pcVar5)(lVar11,(long)&((s.m_art)->zeroth_moment_of_mass).field_0 + lVar6,
              (long)&s.f_bias_eom[-1].torque + lVar15,(long)&s.f_bias_app[-1].torque + lVar15,1);
    mc_wrench_tf_tgt_to_ref
              ((long)&s.x_rel[-1].rotation + lVar15,(long)&s.f_bias_app[-1].torque + lVar15,
               (long)&s.f_bias_tf[-1].torque + lVar15,1);
    lVar8 = (long)&s.f_bias_art[-1].torque + lVar15;
    mc_wrench_add(lVar8,(long)&s.f_bias_tf[-1].torque + lVar15,lVar8,1);
    (**(code **)(gc_acc_twist_accumulate + lVar9))
              (lVar11,(long)&((s.m_art)->zeroth_moment_of_mass).field_0 + lVar6,
               (long)s.tau_ff + local_190,(long)&s.f_ff_jnt[-1].torque + lVar15,1);
    (*pcVar5)(lVar11,(long)&((s.m_art)->zeroth_moment_of_mass).field_0 + lVar6,
              (long)&(s.f_ff_art)->torque + lVar15,(long)&s.f_ff_app[-1].torque + lVar15,1);
    lVar8 = (long)&s.f_ff_app[-1].torque + lVar15;
    mc_wrench_add(lVar8,(long)&s.f_ff_jnt[-1].torque + lVar15,lVar8,1);
    mc_wrench_tf_tgt_to_ref
              ((long)&s.x_rel[-1].rotation + lVar15,(long)&s.f_ff_app[-1].torque + lVar15,
               (long)&s.f_ff_art[-1].torque + lVar15,1);
    (*pcVar5)(lVar11,(long)&((s.m_art)->zeroth_moment_of_mass).field_0 + lVar6,
              (long)&(s.f_ext_art)->torque + lVar15,(long)&s.f_ext_app[-1].torque + lVar15,1);
    mc_wrench_tf_tgt_to_ref
              ((long)&s.x_rel[-1].rotation + lVar15,(long)&s.f_ext_app[-1].torque + lVar15,
               (long)&s.f_ext_tf[-1].torque + lVar15,1);
    lVar8 = (long)&s.f_ext_art[-1].torque + lVar15;
    mc_wrench_add(lVar8,(long)&s.f_ext_tf[-1].torque + lVar15,lVar8,1);
    lVar7 = lVar7 + -0x90;
    uVar10 = (ulong)((int)uVar10 - 1);
    lVar6 = lVar6 + -0xd8;
    lVar15 = lVar15 + -0x10;
  }
  mc_abi_log(s.m_art);
  mc_wrench_log(s.f_bias_art,1);
  mc_wrench_log(s.f_ff_art,1);
  mc_wrench_log(s.f_ext_art,1);
  lVar8 = 0xd8;
  lVar15 = 0x10;
  lVar9 = 0;
  lVar7 = lVar15;
  for (lVar6 = 1; lVar11 = _kca_ifk, lVar6 <= s.nbody; lVar6 = lVar6 + 1) {
    lVar1 = _kca_ifk + lVar15;
    iVar4 = *(int *)(_kca_ifk + lVar15);
    gc_acc_twist_tf_ref_to_tgt
              ((long)&s.x_rel[-1].rotation + lVar7,(long)&s.xdd[-1].angular_acceleration + lVar7,
               (long)&s.xdd_tf[-1].angular_acceleration + lVar7);
    gc_acc_twist_accumulate
              ((long)&s.xdd_tf[-1].angular_acceleration + lVar7,
               (long)&s.xdd_bias[-1].angular_acceleration + lVar7,
               (long)&s.xdd_nact[-1].angular_acceleration + lVar7);
    mc_abi_map_acc_twist_to_wrench
              ((long)&((s.m_art)->zeroth_moment_of_mass).field_0 + lVar8,
               (long)&s.xdd_nact[-1].angular_acceleration + lVar7,
               (long)&s.f_bias_nact[-1].torque + lVar7);
    lVar14 = (long)iVar4 * 0x40;
    pcVar5 = *(code **)(kca_ifk + lVar14);
    (*pcVar5)(lVar1,(long)&s.f_bias_nact[-1].torque + lVar7,(long)s.tau_bias_art + lVar9,1);
    (*pcVar5)(lVar1,(long)&(s.f_ff_art)->torque + lVar7,(long)s.tau_ff_art + lVar9,1);
    (*pcVar5)(lVar1,(long)&(s.f_ext_art)->torque + lVar7,(long)s.tau_ext_art + lVar9,1);
    dVar2 = *(double *)
             ((long)&((s.m_art)->second_moment_of_mass).field_0 +
             lVar8 + (long)*(int *)(lVar11 + 8 + lVar15) * 0x20);
    dVar3 = **(double **)(lVar11 + 0x10 + lVar15);
    dVar16 = ((*(double *)((long)s.tau_ff + lVar9) - *(double *)((long)s.tau_ff_art + lVar9)) -
             *(double *)((long)s.tau_bias_art + lVar9)) - *(double *)((long)s.tau_ext_art + lVar9);
    *(double *)((long)s.tau_ctrl + lVar9) = dVar16;
    *(double *)((long)s.qdd + lVar9) = dVar16 / (dVar2 + dVar3);
    (**(code **)(&two_dof_robot_a + lVar14))
              (lVar1,(long)s.qdd + lVar9,(long)&s.xdd_jnt[-1].angular_acceleration + lVar7);
    gc_acc_twist_add((long)&s.xdd_jnt[-1].angular_acceleration + lVar7,
                     (long)&s.xdd_bias[-1].angular_acceleration + lVar7,
                     (long)&s.xdd_net[-1].angular_acceleration + lVar7);
    gc_acc_twist_accumulate
              ((long)&s.xdd_tf[-1].angular_acceleration + lVar7,
               (long)&s.xdd_net[-1].angular_acceleration + lVar7,
               (long)&(s.xdd)->angular_acceleration + lVar7);
    lVar7 = lVar7 + 0x10;
    lVar8 = lVar8 + 0xd8;
    lVar9 = lVar9 + 8;
    lVar15 = lVar15 + 0x90;
  }
  gc_acc_twist_log(s.xdd + s.nbody);
  return;
}

Assistant:

void aba_c()
{
    struct kcc_kinematic_chain *kc = &two_dof_robot_c;
    struct solver_state_c s;

    setup_simple_state_c(kc, &s);

    s.q[0] = 1.0;
    s.q[1] = 1.0;
    s.qd[0] = 1.0;
    s.qd[1] = 1.0;
    s.f_ext[s.nbody - 1].force[0].x = 1.0;
    s.f_ext[s.nbody - 1].force[0].y = 1.0;
    s.f_ext[s.nbody - 1].force[0].z = 1.0;
    s.tau_ff[0] = 1.0;
    s.tau_ff[1] = 1.0;
    s.xdd->linear_acceleration[0].z = 9.81;


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Position
        //

        // X_{J,i}
        kcc_joint[joint_type].fpk(joint, &s.q[i - 1], &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        gc_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kcc_joint[joint_type].fvk(joint, &s.qd[i - 1], &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        gc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        gc_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kcc_joint[joint_type].inertial_acceleration(joint, &s.xd[i], &s.qd[i - 1], &s.xdd_bias[i - 1]);


        // Inertia
        //

        // M_i^A = M_i
        mc_rbi_to_abi(&kc->segment[i - 1].link.inertia, &s.m_art[i]);


        // Force
        //

        // P_i = M_i Xd_i
        mc_rbi_map_twist_to_momentum(&kc->segment[i - 1].link.inertia, &s.xd[i], &s.p[i - 1]);

        // F_{bias,i}^A = Xd_i x* P_i
        mc_momentum_derive(&s.xd[i], &s.p[i - 1], &s.f_bias_art[i]);


        // F_{ext,i}^A = -F_{ext,i}
        mc_wrench_invert(&s.f_ext[i - 1], &s.f_ext_art[i], 1);
    }


    for (int i = s.nbody; i > 0; i--) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Inertia
        //

        // M_i^a = P_i^T M_i^A
        kcc_joint[joint_type].project_inertia(joint, &s.m_art[i], &s.m_app[i - 1]);

        // M_{i-1}^a' = {i-1}^X_i* M_i^a i^X_{i-1}
        mc_abi_tf_tgt_to_ref(&s.x_rel[i - 1], &s.m_app[i - 1], &s.m_tf[i]);

        // M_{i-1}^A += M_{i-1}^a'
        mc_abi_add(&s.m_art[i - 1], &s.m_tf[i], &s.m_art[i - 1]);


        // Force
        //

        // F_{bias,i}^A' = M_i^A Xdd_{bias,i}
        mc_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_bias[i - 1], &s.f_bias_eom[i - 1]);

        // F_{bias,i}^A' += F_{bias,i}^A
        mc_wrench_add(&s.f_bias_eom[i - 1], &s.f_bias_art[i], &s.f_bias_eom[i - 1], 1);

        // F_{bias,i}^a = P_i^T F_{bias,i}^A'
        kcc_joint[joint_type].project_wrench(joint, &s.m_art[i], &s.f_bias_eom[i - 1], &s.f_bias_app[i - 1], 1);

        // F_{bias,i}^a' = {i-1}^X_i* F_{bias,i}^a
        mc_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_bias_app[i - 1], &s.f_bias_tf[i - 1], 1);

        // F_{bias,i-1}^A += F_{bias,i}^a'
        mc_wrench_add(&s.f_bias_art[i - 1], &s.f_bias_tf[i - 1], &s.f_bias_art[i - 1], 1);


        // F_{tau,i} = M_i^A S_i D^{-1} tau_{ff,i}
        kcc_joint[joint_type].ffd(joint, &s.m_art[i], &s.tau_ff[i - 1], &s.f_ff_jnt[i - 1], 1);

        // F_{tau,i}^a = P_i^T F_{tau,i}^A
        kcc_joint[joint_type].project_wrench(joint, &s.m_art[i], &s.f_ff_art[i], &s.f_ff_app[i - 1], 1);

        // F_{tau,i}^a += F_{tau,i}'
        mc_wrench_add(&s.f_ff_app[i - 1], &s.f_ff_jnt[i - 1], &s.f_ff_app[i - 1], 1);

        // F_{tau,i-1}^A = {i-1}^X_i* F_{tau,i}^a
        mc_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ff_app[i - 1], &s.f_ff_art[i - 1], 1);


        // F_{ext,i}^a = P_i^T F_{ext,i}^A
        kcc_joint[joint_type].project_wrench(joint, &s.m_art[i], &s.f_ext_art[i], &s.f_ext_app[i - 1], 1);

        // F_{ext,i}^a' = {i-1}^X_i* F_{ext,i}^a
        mc_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ext_app[i - 1], &s.f_ext_tf[i - 1], 1);

        // F_{ext,i-1}^A += F_{ext,i}^a'
        mc_wrench_add(&s.f_ext_art[i - 1], &s.f_ext_tf[i - 1], &s.f_ext_art[i - 1], 1);
    }

    mc_abi_log(&s.m_art[0]);
    mc_wrench_log(&s.f_bias_art[0], 1);
    mc_wrench_log(&s.f_ff_art[0], 1);
    mc_wrench_log(&s.f_ext_art[0], 1);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Acceleration
        //

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        gc_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_{nact,i-1} = Xdd_{i-1}' + Xdd_{bias,i-1}
        gc_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_bias[i - 1], &s.xdd_nact[i - 1]);


        // Force
        //

        // F_{nact,i} = M_i^A Xdd_{nact,i-1}'
        mc_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_nact[i - 1], &s.f_bias_nact[i - 1]);

        // tau_{bias,i}^A = S^T F_{bias,i}
        kcc_joint[joint_type].ifk(joint, &s.f_bias_nact[i - 1], &s.tau_bias_art[i - 1], 1);


        // tau_{ff,i}^A = S^T F_{ff,i}
        kcc_joint[joint_type].ifk(joint, &s.f_ff_art[i], &s.tau_ff_art[i - 1], 1);


        // tau_{ext,i}^A = S^T F_{ext,i}
        kcc_joint[joint_type].ifk(joint, &s.f_ext_art[i], &s.tau_ext_art[i - 1], 1);


        // Solve
        //
        int k = joint->revolute_joint.axis;
        double d = s.m_art[i].second_moment_of_mass.row[k].data[k] + joint->revolute_joint.inertia[0];
        s.tau_ctrl[i - 1] = s.tau_ff[i - 1] - s.tau_ff_art[i - 1] - s.tau_bias_art[i - 1] - s.tau_ext_art[i - 1];
        s.qdd[i - 1] = s.tau_ctrl[i - 1] / d;


        // Resultant acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kcc_joint[joint_type].fak(joint, &s.qdd[i - 1], &s.xdd_jnt[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        gc_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        gc_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    gc_acc_twist_log(&s.xdd[s.nbody]);
}